

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O3

void ncnn::transpose_pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong *puVar25;
  undefined1 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM4 [64];
  long local_98;
  long local_90;
  
  auVar38 = in_ZMM4._0_16_;
  iVar7 = cpu_support_x86_avx_vnni_int8();
  if (iVar7 != 0) {
    transpose_pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar7 = A->w;
  lVar20 = (long)iVar7;
  pauVar10 = (undefined1 (*) [16])AT->data;
  uVar24 = 0;
  lVar9 = (long)k;
  lVar28 = (long)i;
  if (7 < max_ii) {
    lVar21 = iVar7 * 3 + lVar28;
    lVar23 = lVar28 + iVar7 * 2;
    lVar32 = lVar20 + lVar28;
    lVar29 = lVar28;
    uVar16 = 0;
    do {
      pvVar6 = A->data;
      lVar30 = A->w * lVar9 * A->elemsize;
      if (3 < max_kk) {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar29);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar32);
        auVar38 = vpunpcklbw_avx(auVar38,auVar40);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar23);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)pvVar6 + lVar30 + lVar21);
        auVar40 = vpunpcklbw_avx(auVar41,auVar42);
        vpunpcklwd_avx(auVar38,auVar40);
        vpunpckhwd_avx(auVar38,auVar40);
        halt_baddata();
      }
      puVar25 = (ulong *)((long)pvVar6 + lVar30 + lVar28 + uVar16);
      iVar18 = 0;
      iVar19 = iVar18;
      if (1 < max_kk) {
        do {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *puVar25;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)puVar25 + lVar20);
          auVar40 = vpunpcklbw_avx(auVar37,auVar39);
          *pauVar10 = auVar40;
          pauVar10 = pauVar10 + 1;
          puVar25 = (ulong *)((long)puVar25 + (long)(iVar7 * 2));
          iVar18 = iVar19 + 2;
          iVar14 = iVar19 + 3;
          iVar19 = iVar18;
        } while (iVar14 < max_kk);
      }
      iVar19 = max_kk - iVar18;
      if (iVar19 != 0 && iVar18 <= max_kk) {
        do {
          *(ulong *)*pauVar10 = *puVar25;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          puVar25 = (ulong *)((long)puVar25 + lVar20);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      uVar24 = uVar16 + 8;
      uVar34 = uVar16 + 0xf;
      lVar29 = lVar29 + 8;
      lVar21 = lVar21 + 8;
      lVar23 = lVar23 + 8;
      lVar32 = lVar32 + 8;
      uVar16 = uVar24;
    } while (uVar34 < (uint)max_ii);
  }
  auVar40 = _DAT_005a39d0;
  lVar23 = (long)max_ii;
  if ((int)((uint)uVar24 | 3) < max_ii) {
    auVar36._4_4_ = iVar7;
    auVar36._0_4_ = iVar7;
    auVar36._8_4_ = iVar7;
    auVar36._12_4_ = iVar7;
    vpmulld_avx(auVar36,_DAT_005a3450);
    uVar16 = uVar24 & 0xffffffff;
    do {
      puVar26 = (undefined1 *)((long)A->data + lVar28 + uVar16 + A->w * lVar9 * A->elemsize);
      iVar19 = 0;
      if (3 < max_kk) {
        auVar38 = vpcmpeqd_avx(auVar38,auVar38);
        auVar38 = vpgatherdd((undefined1  [16])0x0,auVar38);
        vpshufb_avx(auVar38,auVar40);
        halt_baddata();
      }
      iVar18 = iVar19;
      if (1 < max_kk) {
        do {
          (*pauVar10)[0] = *puVar26;
          (*pauVar10)[1] = puVar26[lVar20];
          (*pauVar10)[2] = puVar26[1];
          (*pauVar10)[3] = puVar26[iVar7 + 1];
          (*pauVar10)[4] = puVar26[2];
          (*pauVar10)[5] = puVar26[iVar7 + 2];
          (*pauVar10)[6] = puVar26[3];
          (*pauVar10)[7] = puVar26[iVar7 + 3];
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
          puVar26 = puVar26 + lVar20 * 2;
          iVar19 = iVar18 + 2;
          iVar14 = iVar18 + 3;
          iVar18 = iVar19;
        } while (iVar14 < max_kk);
      }
      iVar18 = max_kk - iVar19;
      if (iVar18 != 0 && iVar19 <= max_kk) {
        puVar26 = puVar26 + 3;
        do {
          (*pauVar10)[0] = puVar26[-3];
          (*pauVar10)[1] = puVar26[-2];
          (*pauVar10)[2] = puVar26[-1];
          (*pauVar10)[3] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
          puVar26 = puVar26 + lVar20;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      uVar24 = uVar16 + 4;
      lVar32 = uVar16 + 7;
      uVar16 = uVar24;
    } while (lVar32 < lVar23);
  }
  if ((int)((uint)uVar24 | 1) < max_ii) {
    lVar35 = (long)(iVar7 * 4);
    lVar32 = lVar28 + (uVar24 & 0xffffffff);
    lVar30 = (iVar7 * 3 + 1) + lVar32;
    lVar29 = (iVar7 + 1) + lVar32;
    lVar21 = iVar7 * 3 + lVar32;
    local_90 = iVar7 * 2 + lVar32;
    local_98 = lVar32 + lVar20;
    uVar16 = uVar24 & 0xffffffff;
    do {
      pvVar6 = A->data;
      lVar27 = A->w * lVar9 * A->elemsize;
      if (max_kk < 4) {
        lVar22 = (long)pvVar6 + lVar28 + uVar16;
        uVar15 = 0;
      }
      else {
        lVar22 = (long)pvVar6 + lVar32;
        lVar33 = lVar30 + (long)pvVar6;
        lVar13 = (long)pvVar6 + lVar29;
        lVar17 = (long)pvVar6 + lVar21;
        lVar31 = (long)pvVar6 + local_90;
        lVar12 = (long)pvVar6 + local_98;
        iVar19 = 0;
        iVar14 = 3;
        iVar18 = 0;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 8);
        do {
          pauVar11 = pauVar10;
          cVar1 = *(char *)(lVar22 + lVar27);
          pauVar11[-1][8] = cVar1;
          cVar2 = *(char *)(lVar12 + lVar27);
          pauVar11[-1][9] = cVar2;
          cVar3 = *(char *)(lVar31 + lVar27);
          pauVar11[-1][10] = cVar3;
          cVar4 = *(char *)(lVar17 + lVar27);
          pauVar11[-1][0xb] = cVar4;
          cVar5 = *(char *)(lVar22 + 1 + lVar27);
          pauVar11[-1][0xc] = cVar5;
          iVar18 = iVar18 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          cVar1 = *(char *)(lVar13 + lVar27);
          pauVar11[-1][0xd] = cVar1;
          cVar2 = *(char *)(lVar31 + 1 + lVar27);
          pauVar11[-1][0xe] = cVar2;
          cVar3 = *(char *)(lVar33 + lVar27);
          pauVar11[-1][0xf] = cVar3;
          iVar19 = iVar19 + cVar5 + (int)cVar1 + (int)cVar2 + (int)cVar3;
          iVar14 = iVar14 + 4;
          lVar22 = lVar22 + lVar35;
          lVar33 = lVar33 + lVar35;
          pauVar10 = (undefined1 (*) [16])(*pauVar11 + 8);
          lVar13 = lVar13 + lVar35;
          lVar17 = lVar17 + lVar35;
          lVar31 = lVar31 + lVar35;
          lVar12 = lVar12 + lVar35;
        } while (iVar14 < max_kk);
        *(int *)*pauVar11 = iVar18 * 0x7f;
        *(int *)(*pauVar11 + 4) = iVar19 * 0x7f;
        uVar15 = max_kk & 0xfffffffc;
      }
      puVar26 = (undefined1 *)(lVar22 + lVar27);
      uVar8 = uVar15 | 1;
      while ((int)uVar8 < max_kk) {
        (*pauVar10)[0] = *puVar26;
        (*pauVar10)[1] = puVar26[lVar20];
        (*pauVar10)[2] = puVar26[1];
        (*pauVar10)[3] = puVar26[iVar7 + 1];
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
        puVar26 = puVar26 + iVar7 * 2;
        uVar8 = uVar15 + 3;
        uVar15 = uVar15 + 2;
      }
      iVar19 = max_kk - uVar15;
      if (iVar19 != 0 && (int)uVar15 <= max_kk) {
        puVar26 = puVar26 + 1;
        do {
          (*pauVar10)[0] = puVar26[-1];
          (*pauVar10)[1] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 2);
          puVar26 = puVar26 + lVar20;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      uVar24 = uVar16 + 2;
      lVar27 = uVar16 + 3;
      lVar32 = lVar32 + 2;
      lVar30 = lVar30 + 2;
      lVar29 = lVar29 + 2;
      lVar21 = lVar21 + 2;
      local_90 = local_90 + 2;
      local_98 = local_98 + 2;
      uVar16 = uVar24;
    } while (lVar27 < lVar23);
  }
  if ((int)uVar24 < max_ii) {
    lVar30 = (long)(iVar7 * 4);
    lVar35 = (long)(int)uVar24;
    lVar32 = lVar35 + lVar28;
    lVar27 = iVar7 * 3 + lVar32;
    lVar21 = iVar7 * 2 + lVar32;
    lVar29 = lVar32 + lVar20;
    do {
      pvVar6 = A->data;
      lVar22 = A->w * lVar9 * A->elemsize;
      if (max_kk < 4) {
        lVar13 = (long)pvVar6 + lVar28 + lVar35;
        uVar15 = 0;
      }
      else {
        lVar13 = (long)pvVar6 + lVar32;
        lVar17 = (long)pvVar6 + lVar27;
        lVar31 = (long)pvVar6 + lVar21;
        lVar12 = (long)pvVar6 + lVar29;
        iVar19 = 0;
        iVar7 = 3;
        pauVar10 = (undefined1 (*) [16])(*pauVar10 + 4);
        do {
          pauVar11 = pauVar10;
          cVar1 = *(char *)(lVar13 + lVar22);
          pauVar11[-1][0xc] = cVar1;
          cVar2 = *(char *)(lVar12 + lVar22);
          pauVar11[-1][0xd] = cVar2;
          cVar3 = *(char *)(lVar31 + lVar22);
          pauVar11[-1][0xe] = cVar3;
          cVar4 = *(char *)(lVar17 + lVar22);
          pauVar11[-1][0xf] = cVar4;
          iVar19 = iVar19 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          iVar7 = iVar7 + 4;
          lVar13 = lVar13 + lVar30;
          lVar17 = lVar17 + lVar30;
          lVar31 = lVar31 + lVar30;
          lVar12 = lVar12 + lVar30;
          pauVar10 = (undefined1 (*) [16])(*pauVar11 + 4);
        } while (iVar7 < max_kk);
        *(int *)*pauVar11 = iVar19 * 0x7f;
        uVar15 = max_kk & 0xfffffffc;
      }
      puVar26 = (undefined1 *)(lVar13 + lVar22);
      iVar7 = max_kk - uVar15;
      if (iVar7 != 0 && (int)uVar15 <= max_kk) {
        do {
          (*pauVar10)[0] = *puVar26;
          pauVar10 = (undefined1 (*) [16])(*pauVar10 + 1);
          puVar26 = puVar26 + lVar20;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      lVar35 = lVar35 + 1;
      lVar32 = lVar32 + 1;
      lVar27 = lVar27 + 1;
      lVar21 = lVar21 + 1;
      lVar29 = lVar29 + 1;
    } while (lVar35 != lVar23);
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}